

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# system.c
# Opt level: O0

int str_path_unsafe(char *str)

{
  int parse_counter;
  char *str_local;
  int local_4;
  
  parse_counter = 0;
  str_local = str;
  do {
    if (*str_local == '\0') {
      if (parse_counter == 2) {
        local_4 = -1;
      }
      else {
        local_4 = 0;
      }
      return local_4;
    }
    if ((*str_local == '\\') || (*str_local == '/')) {
      if (parse_counter == 2) {
        return -1;
      }
      parse_counter = 0;
    }
    else if (-1 < parse_counter) {
      if (*str_local == '.') {
        parse_counter = parse_counter + 1;
      }
      else {
        parse_counter = -1;
      }
    }
    str_local = str_local + 1;
  } while( true );
}

Assistant:

int str_path_unsafe(const char *str)
{
	// State machine. 0 means that we're at the beginning
	// of a new directory/filename, and a positive number represents the number of
	// dots ('.') we found. -1 means we encountered a different character
	// since the last path separator (or the beginning of the string).
	int parse_counter = 0;
	while(*str)
	{
		if(*str == '\\' || *str == '/')
		{
			// A path separator. Check how many dots we found since
			// the last path separator.
			//
			// Two dots => ".." contained in the path. Return an
			// error.
			if(parse_counter == 2)
				return -1;
			else
				parse_counter = 0;
		}
		else if(parse_counter >= 0)
		{
			// If we have not encountered a non-dot character since
			// the last path separator, count the dots.
			if(*str == '.')
				parse_counter++;
			else
				parse_counter = -1;
		}

		++str;
	}
	// If there's a ".." at the end, fail too.
	if(parse_counter == 2)
		return -1;
	return 0;
}